

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstract.c
# Opt level: O2

size_t dictionary_get_all_match_lengths(dictionary_t t_dictionary,ucs4_t *word,size_t *match_length)

{
  uint uVar1;
  size_t sVar2;
  dictionary_desc *dictionary;
  undefined8 in_R8;
  undefined8 in_R9;
  
  uVar1 = *t_dictionary;
  if (uVar1 == 1) {
    sVar2 = dictionary_datrie_get_all_match_lengths
                      (*(dictionary_t *)((long)t_dictionary + 8),word,match_length);
    return sVar2;
  }
  if (uVar1 == 0) {
    sVar2 = dictionary_text_get_all_match_lengths
                      (*(dictionary_t *)((long)t_dictionary + 8),word,match_length);
    return sVar2;
  }
  fprintf(_stderr,"Should not be here %s: %d\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/pkg-ime[P]opencc/src/dictionary/abstract.c"
          ,0x67,in_R8,in_R9,(ulong)uVar1);
  __assert_fail("0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/pkg-ime[P]opencc/src/dictionary/abstract.c"
                ,0x67,
                "size_t dictionary_get_all_match_lengths(dictionary_t, const ucs4_t *, size_t *)");
}

Assistant:

size_t dictionary_get_all_match_lengths(dictionary_t t_dictionary, const ucs4_t * word,
		size_t * match_length)
{
	dictionary_desc * dictionary = (dictionary_desc *) t_dictionary;
	switch (dictionary->type)
	{
	case OPENCC_DICTIONARY_TYPE_TEXT:
		return dictionary_text_get_all_match_lengths(dictionary->dict, word, match_length);
		break;
	case OPENCC_DICTIONARY_TYPE_DATRIE:
		return dictionary_datrie_get_all_match_lengths(dictionary->dict, word, match_length);
		break;
	default:
		debug_should_not_be_here();
	}
	return (size_t) -1;
}